

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  bool bVar1;
  int *piVar2;
  int local_13c;
  string local_138;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  __pid_t local_20;
  int local_1c;
  int gtest_retval;
  int status_value;
  ForkingDeathTest *this_local;
  
  _gtest_retval = this;
  bVar1 = DeathTestImpl::spawned(&this->super_DeathTestImpl);
  if (bVar1) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      do {
        local_20 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,&local_1c,0);
        bVar1 = false;
        if (local_20 == -1) {
          piVar2 = __errno_location();
          bVar1 = *piVar2 == 4;
        }
      } while (bVar1);
      if (local_20 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"CHECK failed: File ",&local_101);
        std::operator+(&local_e0,&local_100,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_c0,&local_e0,", line ");
        local_13c = 0x43d;
        StreamableToString<int>(&local_138,&local_13c);
        std::operator+(&local_a0,&local_c0,&local_138);
        std::operator+(&local_80,&local_a0,": ");
        std::operator+(&local_60,&local_80,"waitpid(child_pid_, &status_value, 0)");
        std::operator+(&local_40,&local_60," != -1");
        DeathTestAbort(&local_40);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_status(&this->super_DeathTestImpl,local_1c);
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned()) return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}